

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

QDebug operator<<(QDebug *d,QHostAddress *address)

{
  bool bVar1;
  QDebug *this;
  undefined8 in_RDX;
  QHostAddress *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  undefined7 in_stack_ffffffffffffff98;
  char in_stack_ffffffffffffff9f;
  QDebug *in_stack_ffffffffffffffa0;
  Stream *this_00;
  SpecialAddress other;
  QHostAddress *this_01;
  char *in_stack_ffffffffffffffe8;
  undefined8 local_10;
  long local_8;
  
  other = (SpecialAddress)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  this_01 = in_RSI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,(QDebug *)in_RSI);
  this = (QDebug *)QDebug::resetFormat();
  QDebug::nospace(this);
  bVar1 = QHostAddress::operator==(this_01,other);
  if (bVar1) {
    QDebug::operator<<((QDebug *)in_RSI,in_stack_ffffffffffffffe8);
  }
  else {
    in_stack_ffffffffffffffa0 = QDebug::operator<<((QDebug *)in_RSI,in_stack_ffffffffffffffe8);
    QHostAddress::toString(in_RSI);
    QDebug::operator<<((QDebug *)this_00,(QString *)in_RDI);
    QDebug::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
    QString::~QString((QString *)0x218722);
  }
  QDebug::QDebug(in_stack_ffffffffffffffa0,
                 (QDebug *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug d, const QHostAddress &address)
{
    QDebugStateSaver saver(d);
    d.resetFormat().nospace();
    if (address == QHostAddress::Any)
        d << "QHostAddress(QHostAddress::Any)";
    else
        d << "QHostAddress(" << address.toString() << ')';
    return d;
}